

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cxx
# Opt level: O0

void glauber::anon_unknown_2::write_text_file
               (path *output_dir,int width,int num,double impact_param,Event *event)

{
  bool bVar1;
  type_conflict4 tVar2;
  ostream *poVar3;
  int *piVar4;
  double *pdVar5;
  Grid *this;
  Event *in_RCX;
  int in_EDX;
  int in_ESI;
  double in_XMM0_Qa;
  const_iterator *iter;
  reference *row;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  Grid *__range2_1;
  pair<const_int,_double> *ecc;
  const_iterator __end2;
  const_iterator __begin2;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *__range2;
  ofstream ofs;
  ostringstream padded_fname;
  string_type *in_stack_fffffffffffff9f8;
  iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long,_false,_false>
  *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  byte in_stack_fffffffffffffa0f;
  array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>
  *in_stack_fffffffffffffa10;
  path *in_stack_fffffffffffffa20;
  const_sub_array<double,_1UL,_const_double_*> *in_stack_fffffffffffffa28;
  undefined1 local_4e8 [40];
  undefined1 *local_4c0;
  undefined1 local_4b8 [32];
  undefined1 *local_498;
  Grid *local_440;
  reference local_438;
  _Self local_430;
  _Self local_428;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_420;
  int local_414;
  string local_410 [96];
  ostream local_3b0;
  char local_1ad;
  int local_19c;
  ostringstream local_198 [376];
  Event *local_20;
  double local_18;
  int local_10;
  int local_c;
  
  local_20 = in_RCX;
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_19c = (int)std::setw(local_c);
  poVar3 = std::operator<<((ostream *)local_198,(_Setw)local_19c);
  local_1ad = (char)std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,local_1ad);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
  std::operator<<(poVar3,".dat");
  std::__cxx11::ostringstream::str();
  boost::filesystem::path::path((path *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  boost::filesystem::operator/((path *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  boost::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa10,
             (path *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
  boost::filesystem::path::~path((path *)0x181f79);
  boost::filesystem::path::~path((path *)0x181f86);
  std::__cxx11::string::~string(local_410);
  local_414 = (int)std::setprecision(10);
  poVar3 = std::operator<<(&local_3b0,(_Setprecision)local_414);
  poVar3 = std::operator<<(poVar3,"# event ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
  poVar3 = std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(poVar3,"# b     = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  poVar3 = std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(poVar3,"# npart = ");
  piVar4 = Event::npart(local_20);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(poVar3,"# mult  = ");
  pdVar5 = Event::multiplicity(local_20);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
  std::operator<<(poVar3,'\n');
  local_420 = Event::eccentricity(local_20);
  local_428._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::begin
                 ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)in_stack_fffffffffffff9f8);
  local_430._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                 ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)in_stack_fffffffffffff9f8);
  while( true ) {
    bVar1 = std::operator!=(&local_428,&local_430);
    if (!bVar1) break;
    local_438 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator*
                          ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)
                           in_stack_fffffffffffffa00);
    poVar3 = std::operator<<(&local_3b0,"# e");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_438->first);
    poVar3 = std::operator<<(poVar3,"    = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_438->second);
    std::operator<<(poVar3,'\n');
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)in_stack_fffffffffffffa00);
  }
  this = Event::reduced_thickness_grid(local_20);
  local_440 = this;
  boost::multi_array_ref<double,_2UL>::begin
            ((multi_array_ref<double,_2UL> *)in_stack_fffffffffffff9f8);
  boost::multi_array_ref<double,_2UL>::end
            ((multi_array_ref<double,_2UL> *)in_stack_fffffffffffff9f8);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long>
                        *)in_stack_fffffffffffffa10,
                       (iterator_facade<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long>
                        *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    if (!tVar2) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long,_false,_false>
                 *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
    local_498 = local_4b8;
    boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>::begin
              (in_stack_fffffffffffffa28);
    local_4c0 = local_4e8;
    do {
      in_stack_fffffffffffffa28 =
           (const_sub_array<double,_1UL,_const_double_*> *)
           boost::iterators::detail::
           iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
           ::operator*((iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
                        *)0x1823df);
      poVar3 = (ostream *)
               std::ostream::operator<<(&local_3b0,*(double *)&in_stack_fffffffffffffa28->base_);
      std::operator<<(poVar3,' ');
      boost::iterators::detail::
      iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
                    *)in_stack_fffffffffffffa00);
      boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>::end
                ((const_sub_array<double,_1UL,_const_double_*> *)this);
      in_stack_fffffffffffffa10 =
           boost::iterators::detail::
           iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_true,_false>
           ::operator--((iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_true,_false>
                         *)in_stack_fffffffffffffa00);
      in_stack_fffffffffffffa0f =
           boost::iterators::operator!=
                     ((iterator_facade<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long>
                       *)in_stack_fffffffffffffa10,
                      (iterator_facade<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long>
                       *)CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
      boost::detail::multi_array::
      array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>
      ::~array_iterator((array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>
                         *)0x182477);
    } while ((in_stack_fffffffffffffa0f & 1) != 0);
    in_stack_fffffffffffffa00 =
         (iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long,_false,_false>
          *)boost::iterators::detail::
            iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>,_double,_boost::iterators::random_access_traversal_tag,_const_double_&,_long,_false,_false>
                         *)0x182490);
    poVar3 = (ostream *)std::ostream::operator<<(&local_3b0,*(double *)in_stack_fffffffffffffa00);
    std::operator<<(poVar3,'\n');
    boost::detail::multi_array::
    array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>
    ::~array_iterator((array_iterator<double,_const_double_*,_mpl_::size_t<1UL>,_const_double_&,_boost::iterators::random_access_traversal_tag>
                       *)0x1824d0);
    boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>::~const_sub_array
              ((const_sub_array<double,_1UL,_const_double_*> *)0x1824dd);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::multi_array::array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>,_boost::multi_array<double,_1UL,_std::allocator<double>_>,_boost::iterators::random_access_traversal_tag,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_long,_false,_false>
    ::operator++(in_stack_fffffffffffffa00);
  }
  boost::detail::multi_array::
  array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>
  ::~array_iterator((array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>
                     *)0x182340);
  boost::detail::multi_array::
  array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>
  ::~array_iterator((array_iterator<double,_const_double_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<double,_1UL,_const_double_*>,_boost::iterators::random_access_traversal_tag>
                     *)0x18234d);
  boost::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa00);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void write_text_file(const fs::path& output_dir, int width,
    int num, double impact_param, const Event& event) {
  // Open a numbered file in the output directory.
  // Pad the filename with zeros.
  std::ostringstream padded_fname{};
  padded_fname << std::setw(width) << std::setfill('0') << num << ".dat";
  fs::ofstream ofs{output_dir / padded_fname.str()};

  // Write a commented header of event properties as key = value pairs.
  ofs << std::setprecision(10)
      << "# event "   << num                  << '\n'
      << "# b     = " << impact_param         << '\n'
      << "# npart = " << event.npart()        << '\n'
      << "# mult  = " << event.multiplicity() << '\n';

  for (const auto& ecc : event.eccentricity())
    ofs << "# e" << ecc.first << "    = " << ecc.second << '\n';

  // Write IC profile as a block grid.  Use C++ default float format (not
  // fixed-width) so that trailing zeros are omitted.  This significantly
  // increases output speed and saves disk space since many grid elements are
  // zero.
  for (const auto& row : event.reduced_thickness_grid()) {
    auto&& iter = row.begin();
    // Write all row elements except the last with a space delimiter afterwards.
    do {
      ofs << *iter << ' ';
    } while (++iter != --row.end());

    // Write the last element and a linebreak.
    ofs << *iter << '\n';
  }
}